

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

string * __thiscall
EdgeEnv::MakePathList_abi_cxx11_
          (string *__return_storage_ptr__,EdgeEnv *this,Node **span,size_t size,char sep)

{
  ulong uVar1;
  string local_70;
  string *local_50;
  string *path;
  undefined8 *local_38;
  Node **i;
  size_t sStack_28;
  char sep_local;
  size_t size_local;
  Node **span_local;
  EdgeEnv *this_local;
  string *result;
  
  i._6_1_ = 0;
  i._7_1_ = sep;
  sStack_28 = size;
  size_local = (size_t)span;
  span_local = (Node **)this;
  this_local = (EdgeEnv *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_38 = (undefined8 *)size_local; local_38 != (undefined8 *)(size_local + sStack_28 * 8);
      local_38 = local_38 + 1) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    Node::PathDecanonicalized_abi_cxx11_(&local_70,(Node *)*local_38);
    local_50 = &local_70;
    if (this->escape_in_out_ == kShellEscape) {
      GetShellEscapedString(local_50,__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EdgeEnv::MakePathList(const Node* const* const span,
                                  const size_t size, const char sep) const {
  string result;
  for (const Node* const* i = span; i != span + size; ++i) {
    if (!result.empty())
      result.push_back(sep);
    const string& path = (*i)->PathDecanonicalized();
    if (escape_in_out_ == kShellEscape) {
#ifdef _WIN32
      GetWin32EscapedString(path, &result);
#else
      GetShellEscapedString(path, &result);
#endif
    } else {
      result.append(path);
    }
  }
  return result;
}